

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator*(Clifford *__return_storage_ptr__,float tv,Clifford *A)

{
  int tBase;
  bool bVar1;
  pointer pBVar2;
  double dVar3;
  Blade local_64;
  Blade *local_58;
  Blade local_50;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_48 [3];
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_30;
  idx a;
  Clifford *A_local;
  float tv_local;
  Clifford *R;
  
  a._M_current._7_1_ = 0;
  std::vector<Blade,_std::allocator<Blade>_>::vector(__return_storage_ptr__);
  local_30._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(A);
  dVar3 = std::fabs((double)(ulong)(uint)tv);
  if (SUB84(dVar3,0) <= 1e-06) {
    Blade::Blade(&local_64);
    std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_64);
    Blade::~Blade(&local_64);
  }
  else {
    while( true ) {
      local_48[0]._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::end(A);
      bVar1 = __gnu_cxx::operator!=(&local_30,local_48);
      if (!bVar1) break;
      pBVar2 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_30);
      tBase = pBVar2->mBase;
      pBVar2 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_30);
      Blade::Blade(&local_50,tBase,tv * pBVar2->mVal);
      std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_50);
      Blade::~Blade(&local_50);
      local_58 = (Blade *)__gnu_cxx::
                          __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                          operator++(&local_30,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator*(float tv, Clifford A)
{
	Clifford R;
	idx a=A.begin();
	if(fabs(tv)>Error2)
	{
		while(a!=A.end())
		{	
		R.push_back(Blade(a->mBase,tv*a->mVal));
		a++;
		}
	return R;
	}
	else
	{
	R.push_back(Blade());
	}
	return R;
}